

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int bam_hdr_write(BGZF *fp,bam_hdr_t *h)

{
  char *__s;
  size_t sVar1;
  char *p;
  int32_t x;
  int32_t name_len;
  int32_t i;
  char buf [4];
  bam_hdr_t *h_local;
  BGZF *fp_local;
  
  _i = h;
  strncpy((char *)&name_len,"BAM\x01",4);
  bgzf_write(fp,&name_len,4);
  if ((*(int *)fp << 0xc) >> 0x1e == 0) {
    bgzf_write(fp,&_i->l_text,4);
    if (_i->l_text != 0) {
      bgzf_write(fp,_i->text,(ulong)_i->l_text);
    }
    bgzf_write(fp,_i,4);
  }
  else {
    p._0_4_ = ed_swap_4(_i->l_text);
    bgzf_write(fp,&p,4);
    if (_i->l_text != 0) {
      bgzf_write(fp,_i->text,(ulong)_i->l_text);
    }
    p._0_4_ = ed_swap_4(_i->n_targets);
    bgzf_write(fp,&p,4);
  }
  for (x = 0; x != _i->n_targets; x = x + 1) {
    __s = _i->target_name[x];
    sVar1 = strlen(__s);
    p._4_4_ = (int)sVar1 + 1;
    if ((*(int *)fp << 0xc) >> 0x1e == 0) {
      bgzf_write(fp,(void *)((long)&p + 4),4);
    }
    else {
      p._0_4_ = ed_swap_4(p._4_4_);
      bgzf_write(fp,&p,4);
    }
    bgzf_write(fp,__s,(long)(int)p._4_4_);
    if ((*(int *)fp << 0xc) >> 0x1e == 0) {
      bgzf_write(fp,_i->target_len + x,4);
    }
    else {
      p._0_4_ = ed_swap_4(_i->target_len[x]);
      bgzf_write(fp,&p,4);
    }
  }
  bgzf_flush(fp);
  return 0;
}

Assistant:

int bam_hdr_write(BGZF *fp, const bam_hdr_t *h)
{
    char buf[4];
    int32_t i, name_len, x;
    // write "BAM1"
    strncpy(buf, "BAM\1", 4);
    bgzf_write(fp, buf, 4);
    // write plain text and the number of reference sequences
    if (fp->is_be) {
        x = ed_swap_4(h->l_text);
        bgzf_write(fp, &x, 4);
        if (h->l_text) bgzf_write(fp, h->text, h->l_text);
        x = ed_swap_4(h->n_targets);
        bgzf_write(fp, &x, 4);
    } else {
        bgzf_write(fp, &h->l_text, 4);
        if (h->l_text) bgzf_write(fp, h->text, h->l_text);
        bgzf_write(fp, &h->n_targets, 4);
    }
    // write sequence names and lengths
    for (i = 0; i != h->n_targets; ++i) {
        char *p = h->target_name[i];
        name_len = strlen(p) + 1;
        if (fp->is_be) {
            x = ed_swap_4(name_len);
            bgzf_write(fp, &x, 4);
        } else bgzf_write(fp, &name_len, 4);
        bgzf_write(fp, p, name_len);
        if (fp->is_be) {
            x = ed_swap_4(h->target_len[i]);
            bgzf_write(fp, &x, 4);
        } else bgzf_write(fp, &h->target_len[i], 4);
    }
    bgzf_flush(fp);
    return 0;
}